

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O3

void __thiscall
ElfSection::writeHeader(ElfSection *this,ByteArray *data,size_t pos,Endianness endianness)

{
  ByteArray::replaceDoubleWord(data,pos,(this->header).sh_name,endianness);
  ByteArray::replaceDoubleWord(data,pos + 4,(this->header).sh_type,endianness);
  ByteArray::replaceDoubleWord(data,pos + 8,(this->header).sh_flags,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0xc,(this->header).sh_addr,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x10,(this->header).sh_offset,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x14,(this->header).sh_size,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x18,(this->header).sh_link,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x1c,(this->header).sh_info,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x20,(this->header).sh_addralign,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x24,(this->header).sh_entsize,endianness);
  return;
}

Assistant:

void ElfSection::writeHeader(ByteArray& data, size_t pos, Endianness endianness)
{
	data.replaceDoubleWord(pos + 0x00, header.sh_name, endianness);
	data.replaceDoubleWord(pos + 0x04, header.sh_type, endianness);
	data.replaceDoubleWord(pos + 0x08, header.sh_flags, endianness);
	data.replaceDoubleWord(pos + 0x0C, header.sh_addr, endianness);
	data.replaceDoubleWord(pos + 0x10, header.sh_offset, endianness);
	data.replaceDoubleWord(pos + 0x14, header.sh_size, endianness);
	data.replaceDoubleWord(pos + 0x18, header.sh_link, endianness);
	data.replaceDoubleWord(pos + 0x1C, header.sh_info, endianness);
	data.replaceDoubleWord(pos + 0x20, header.sh_addralign, endianness);
	data.replaceDoubleWord(pos + 0x24, header.sh_entsize, endianness);
}